

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sampleInsert(Stat4Accum *p,Stat4Sample *pNew,int nEqZero)

{
  uint uVar1;
  tRowcnt *ptVar2;
  tRowcnt *ptVar3;
  tRowcnt *ptVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Stat4Sample *pSVar9;
  uint uVar10;
  ulong uVar11;
  Stat4Sample *pSVar12;
  
  if (p->nMaxEqZero < nEqZero) {
    p->nMaxEqZero = nEqZero;
  }
  if (pNew->isPSample == '\0') {
    iVar6 = p->nSample + 1;
    pSVar12 = (Stat4Sample *)0x0;
    lVar8 = (ulong)(uint)p->nSample * 0x30;
    do {
      iVar6 = iVar6 + -1;
      if (iVar6 < 1) {
        if (pSVar12 == (Stat4Sample *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNew->iCol;
          pSVar12->iCol = iVar6;
          pSVar12->anEq[iVar6] = pNew->anEq[iVar6];
          iVar6 = 5;
        }
        goto LAB_00194cc3;
      }
      pSVar9 = p->a;
      bVar5 = true;
      if (*(int *)(*(long *)((long)&pSVar9[-1].anEq + lVar8) + (long)pNew->iCol * 4) == 0) {
        if ((&pSVar9[-1].isPSample)[lVar8] != '\0') {
          bVar5 = false;
          goto LAB_00194c5e;
        }
        pSVar9 = (Stat4Sample *)((long)&pSVar9[-1].anEq + lVar8);
        if ((pSVar12 != (Stat4Sample *)0x0) &&
           (iVar7 = sampleIsBetter(p,pSVar9,pSVar12), iVar7 == 0)) goto LAB_00194c5e;
      }
      else {
LAB_00194c5e:
        pSVar9 = pSVar12;
      }
      pSVar12 = pSVar9;
      lVar8 = lVar8 + -0x30;
    } while (bVar5);
    iVar6 = 1;
LAB_00194cc3:
    if (iVar6 == 5) goto LAB_00194bb9;
    if (iVar6 != 0) {
      return;
    }
  }
  if (p->mxSample <= p->nSample) {
    iVar6 = p->iMin;
    pSVar9 = p->a;
    pSVar12 = pSVar9 + iVar6;
    ptVar2 = pSVar9[iVar6].anEq;
    ptVar3 = pSVar9[iVar6].anDLt;
    ptVar4 = pSVar9[iVar6].anLt;
    if (pSVar9[iVar6].nRowid != 0) {
      if ((pSVar12->u).aRowid != (u8 *)0x0) {
        sqlite3DbFreeNN(p->db,(pSVar12->u).aRowid);
      }
      pSVar12->nRowid = 0;
    }
    memmove(pSVar12,pSVar12 + 1,(long)(~p->iMin + p->nSample) * 0x30);
    pSVar12 = p->a;
    lVar8 = (long)p->nSample;
    pSVar12[lVar8 + -1].nRowid = 0;
    pSVar12[lVar8 + -1].anEq = ptVar2;
    pSVar12[lVar8 + -1].anDLt = ptVar3;
    pSVar12[lVar8 + -1].anLt = ptVar4;
    p->nSample = p->mxSample + -1;
  }
  pSVar12 = p->a;
  iVar6 = p->nSample;
  sampleCopy(p,pSVar12 + iVar6,pNew);
  p->nSample = p->nSample + 1;
  memset(pSVar12[iVar6].anEq,0,(long)nEqZero << 2);
LAB_00194bb9:
  uVar1 = p->mxSample;
  if ((int)uVar1 <= p->nSample) {
    if ((int)uVar1 < 1) {
      uVar10 = 0xffffffff;
    }
    else {
      pSVar12 = p->a;
      uVar10 = 0xffffffff;
      uVar11 = 0;
      pSVar9 = pSVar12;
      do {
        if ((pSVar9->isPSample == '\0') &&
           (((int)uVar10 < 0 || (iVar6 = sampleIsBetter(p,pSVar12 + uVar10,pSVar9), iVar6 != 0)))) {
          uVar10 = (uint)uVar11;
        }
        uVar11 = uVar11 + 1;
        pSVar9 = pSVar9 + 1;
      } while (uVar1 != uVar11);
    }
    p->iMin = uVar10;
  }
  return;
}

Assistant:

static void sampleInsert(Stat4Accum *p, Stat4Sample *pNew, int nEqZero){
  Stat4Sample *pSample = 0;
  int i;

  assert( IsStat4 || nEqZero==0 );

#ifdef SQLITE_ENABLE_STAT4
  /* Stat4Accum.nMaxEqZero is set to the maximum number of leading 0
  ** values in the anEq[] array of any sample in Stat4Accum.a[]. In
  ** other words, if nMaxEqZero is n, then it is guaranteed that there
  ** are no samples with Stat4Sample.anEq[m]==0 for (m>=n). */
  if( nEqZero>p->nMaxEqZero ){
    p->nMaxEqZero = nEqZero;
  }
  if( pNew->isPSample==0 ){
    Stat4Sample *pUpgrade = 0;
    assert( pNew->anEq[pNew->iCol]>0 );

    /* This sample is being added because the prefix that ends in column 
    ** iCol occurs many times in the table. However, if we have already
    ** added a sample that shares this prefix, there is no need to add
    ** this one. Instead, upgrade the priority of the highest priority
    ** existing sample that shares this prefix.  */
    for(i=p->nSample-1; i>=0; i--){
      Stat4Sample *pOld = &p->a[i];
      if( pOld->anEq[pNew->iCol]==0 ){
        if( pOld->isPSample ) return;
        assert( pOld->iCol>pNew->iCol );
        assert( sampleIsBetter(p, pNew, pOld) );
        if( pUpgrade==0 || sampleIsBetter(p, pOld, pUpgrade) ){
          pUpgrade = pOld;
        }
      }
    }
    if( pUpgrade ){
      pUpgrade->iCol = pNew->iCol;
      pUpgrade->anEq[pUpgrade->iCol] = pNew->anEq[pUpgrade->iCol];
      goto find_new_min;
    }
  }
#endif

  /* If necessary, remove sample iMin to make room for the new sample. */
  if( p->nSample>=p->mxSample ){
    Stat4Sample *pMin = &p->a[p->iMin];
    tRowcnt *anEq = pMin->anEq;
    tRowcnt *anLt = pMin->anLt;
    tRowcnt *anDLt = pMin->anDLt;
    sampleClear(p->db, pMin);
    memmove(pMin, &pMin[1], sizeof(p->a[0])*(p->nSample-p->iMin-1));
    pSample = &p->a[p->nSample-1];
    pSample->nRowid = 0;
    pSample->anEq = anEq;
    pSample->anDLt = anDLt;
    pSample->anLt = anLt;
    p->nSample = p->mxSample-1;
  }

  /* The "rows less-than" for the rowid column must be greater than that
  ** for the last sample in the p->a[] array. Otherwise, the samples would
  ** be out of order. */
#ifdef SQLITE_ENABLE_STAT4
  assert( p->nSample==0 
       || pNew->anLt[p->nCol-1] > p->a[p->nSample-1].anLt[p->nCol-1] );
#endif

  /* Insert the new sample */
  pSample = &p->a[p->nSample];
  sampleCopy(p, pSample, pNew);
  p->nSample++;

  /* Zero the first nEqZero entries in the anEq[] array. */
  memset(pSample->anEq, 0, sizeof(tRowcnt)*nEqZero);

#ifdef SQLITE_ENABLE_STAT4
 find_new_min:
#endif
  if( p->nSample>=p->mxSample ){
    int iMin = -1;
    for(i=0; i<p->mxSample; i++){
      if( p->a[i].isPSample ) continue;
      if( iMin<0 || sampleIsBetter(p, &p->a[iMin], &p->a[i]) ){
        iMin = i;
      }
    }
    assert( iMin>=0 );
    p->iMin = iMin;
  }
}